

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string config;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_88;
  undefined1 local_80 [32];
  string local_60;
  cmGeneratorExpression local_40;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  bVar1 = std::operator==(language,"Fortran");
  if (bVar1) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  std::__cxx11::string::string((string *)&local_60,"COMPILE_FLAGS",(allocator *)&local_40);
  pcVar2 = cmSourceFile::GetProperty(source,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_60,
               (string *)&(this->LocalGenerator->super_cmLocalCommonGenerator).ConfigName);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_80);
    cmGeneratorExpression::cmGeneratorExpression(&local_40,(cmListFileBacktrace *)local_80);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_80,(char *)&local_40);
    this_00 = local_80._0_8_;
    local_80._0_8_ = (cmState *)0x0;
    local_88.x_ = (cmCompiledGeneratorExpression *)this_00;
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_80);
    local_80._0_8_ = local_80 + 0x10;
    local_80._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_80[0x10] = '\0';
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)this_00,
                        (cmLocalGenerator *)this->LocalGenerator,&local_60,false,
                        (this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[7])(this->LocalGenerator,__return_storage_ptr__,pcVar2);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_88);
    cmGeneratorExpression::~cmGeneratorExpression(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
  }

  // Add source file specific flags.
  if (const char* cflags = source->GetProperty("COMPILE_FLAGS")) {
    std::string config = this->LocalGenerator->GetConfigName();
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(cflags);
    const char* evaluatedFlags = cge->Evaluate(this->LocalGenerator, config,
                                               false, this->GeneratorTarget);
    this->LocalGenerator->AppendFlags(flags, evaluatedFlags);
  }

  return flags;
}